

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::PrimitiveObjFieldGenerator::~PrimitiveObjFieldGenerator
          (PrimitiveObjFieldGenerator *this)

{
  SingleFieldGenerator::~SingleFieldGenerator((SingleFieldGenerator *)this);
  operator_delete(this);
  return;
}

Assistant:

RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator(
    const FieldDescriptor* descriptor, const Options& options)
    : RepeatedFieldGenerator(descriptor, options) {
  SetPrimitiveVariables(descriptor, &variables_);

  std::string base_name = PrimitiveArrayTypeName(descriptor);
  if (base_name.length()) {
    variables_["array_storage_type"] = "GPB" + base_name + "Array";
  } else {
    variables_["array_storage_type"] = "NSMutableArray";
    variables_["array_property_type"] =
        "NSMutableArray<" + variables_["storage_type"] + "*>";
  }
}